

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O1

FVoxelDef * R_LoadVoxelDef(int lumpnum,int spin)

{
  FVoxel *pFVar1;
  FVoxelDef *pFVar2;
  char *pcVar3;
  
  pFVar1 = R_LoadKVX(lumpnum);
  if (pFVar1 == (FVoxel *)0x0) {
    pcVar3 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
    pFVar2 = (FVoxelDef *)0x0;
    Printf("%s is not a valid voxel file\n",pcVar3);
  }
  else {
    pFVar2 = (FVoxelDef *)operator_new(0x28);
    pFVar2->Voxel = pFVar1;
    pFVar2->Scale = 1.0;
    pFVar2->PlacedSpin = spin;
    pFVar2->DroppedSpin = spin;
    (pFVar2->AngleOffset).Degrees = 90.0;
    TArray<FVoxel_*,_FVoxel_*>::Grow(&Voxels.super_TArray<FVoxel_*,_FVoxel_*>,1);
    Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Array[Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count] =
         pFVar1;
    Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count =
         Voxels.super_TArray<FVoxel_*,_FVoxel_*>.Count + 1;
    TArray<FVoxelDef_*,_FVoxelDef_*>::Grow(&VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>,1);
    VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Array
    [VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Count] = pFVar2;
    VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Count =
         VoxelDefs.super_TArray<FVoxelDef_*,_FVoxelDef_*>.Count + 1;
  }
  return pFVar2;
}

Assistant:

FVoxelDef *R_LoadVoxelDef(int lumpnum, int spin)
{
	FVoxel *vox = R_LoadKVX(lumpnum);
	if (vox == NULL)
	{
		Printf("%s is not a valid voxel file\n", Wads.GetLumpFullName(lumpnum));
		return NULL;
	}
	else
	{
		FVoxelDef *voxdef = new FVoxelDef;
		voxdef->Voxel = vox;
		voxdef->Scale = 1.;
		voxdef->DroppedSpin = voxdef->PlacedSpin = spin;
		voxdef->AngleOffset = 90.;

		Voxels.Push(vox);
		VoxelDefs.Push(voxdef);
		return voxdef;
	}
}